

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
div_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(div_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,const_reference lhs,const_reference rhs,error_code *param_3)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other;
  unsigned_long uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  double dVar8;
  double dVar9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar10;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_number(rhs)
  ;
  if (bVar1) {
    bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_number
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )param_3);
    if (bVar1) {
      bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_int64
                        (rhs);
      if (bVar1) {
        bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_int64
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)param_3);
        if (!bVar1) goto LAB_00439224;
        lVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                as_integer<long>(rhs);
        lVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                as_integer<long>((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)param_3);
        uVar4 = lVar2 / lVar3;
        uVar7 = lVar2 % lVar3;
        *(undefined2 *)
         &(this->
          super_binary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )._vptr_binary_operator = 2;
LAB_0043925f:
        (this->
        super_binary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ).precedence_level_ = uVar4;
      }
      else {
LAB_00439224:
        bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_uint64(rhs);
        if (bVar1) {
          bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_uint64((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)param_3);
          if (bVar1) {
            uVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                    as_integer<unsigned_long>(rhs);
            uVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                    as_integer<unsigned_long>
                              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)param_3);
            uVar4 = uVar5 / uVar6;
            uVar7 = uVar5 % uVar6;
            *(undefined2 *)
             &(this->
              super_binary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              )._vptr_binary_operator = 3;
            goto LAB_0043925f;
          }
        }
        dVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                as_double(rhs);
        dVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                as_double((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)param_3);
        *(undefined2 *)
         &(this->
          super_binary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )._vptr_binary_operator = 5;
        (this->
        super_binary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ).precedence_level_ = (size_t)(dVar8 / dVar9);
        uVar7 = extraout_RDX_00;
      }
      goto LAB_00439217;
    }
  }
  other = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             other);
  uVar7 = extraout_RDX;
LAB_00439217:
  bVar10.field_0.int64_.val_ = uVar7;
  bVar10.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar10.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            //std::cout << "operator/ lhs: " << lhs << ", rhs: " << rhs << "\n";

            if (!(lhs.is_number() && rhs.is_number()))
            {
                return Json::null();
            }
            if (lhs.is_int64() && rhs.is_int64())
            {
                return Json(((lhs.template as<int64_t>() / rhs.template as<int64_t>())), semantic_tag::none);
            }
            if (lhs.is_uint64() && rhs.is_uint64())
            {
                return Json((lhs.template as<uint64_t>() / rhs.template as<uint64_t>()), semantic_tag::none);
            }
            return Json((lhs.as_double() / rhs.as_double()), semantic_tag::none);
        }